

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::consume(Buffer *this,size_t consumedBytes)

{
  size_type sVar1;
  allocator_type local_49;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  vector<char,_std::allocator<char>_> local_30;
  size_t local_18;
  size_t consumedBytes_local;
  Buffer *this_local;
  
  local_18 = consumedBytes;
  consumedBytes_local = (size_t)this;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->data);
  if (sVar1 < consumedBytes) {
    std::vector<char,_std::allocator<char>_>::clear(&this->data);
  }
  else {
    local_40._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->data);
    local_38 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator+(&local_40,local_18);
    local_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->data);
    std::allocator<char>::allocator();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_30,local_38,local_48,&local_49);
    std::vector<char,_std::allocator<char>_>::operator=(&this->data,&local_30);
    std::vector<char,_std::allocator<char>_>::~vector(&local_30);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

void Buffer::consume(std::size_t consumedBytes) {
    if(consumedBytes > data.size()){
        data.clear();
    }
    else{
        data = std::vector<char>(data.begin() + consumedBytes, data.end());
    }
}